

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_ecdsa_edge_cases(void)

{
  byte bVar1;
  ulong uVar2;
  undefined8 uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  char cVar11;
  int iVar12;
  secp256k1_context *extraout_RAX;
  secp256k1_context *extraout_RAX_00;
  secp256k1_context *extraout_RAX_01;
  secp256k1_context *extraout_RAX_02;
  secp256k1_context *extraout_RAX_03;
  secp256k1_context *extraout_RAX_04;
  secp256k1_context *extraout_RAX_05;
  secp256k1_context *extraout_RAX_06;
  secp256k1_context *extraout_RAX_07;
  secp256k1_context *extraout_RAX_08;
  secp256k1_context *extraout_RAX_09;
  secp256k1_context *extraout_RAX_10;
  secp256k1_context *extraout_RAX_11;
  secp256k1_context *extraout_RAX_12;
  secp256k1_context *extraout_RAX_13;
  secp256k1_context *extraout_RAX_14;
  secp256k1_context *extraout_RAX_15;
  secp256k1_context *extraout_RAX_16;
  long lVar13;
  long lVar14;
  ulong uVar15;
  secp256k1_ge *r;
  secp256k1_ge *psVar16;
  uint64_t *puVar17;
  secp256k1_context *psVar18;
  size_t *psVar19;
  secp256k1_context *psVar20;
  code *msg32;
  secp256k1_ge *psVar21;
  secp256k1_gej *r_00;
  secp256k1_scalar *r_01;
  int32_t _calls_to_callback_9;
  secp256k1_scalar ss_2;
  secp256k1_scalar sr;
  secp256k1_scalar ss;
  secp256k1_scalar msg;
  size_t siglen;
  secp256k1_ecdsa_signature sig;
  secp256k1_gej keyj;
  ulong local_4180;
  undefined1 local_4178 [32];
  undefined1 local_4158 [16];
  undefined1 auStack_4148 [16];
  undefined1 local_4138 [8];
  ulong uStack_4130;
  undefined1 auStack_4128 [16];
  uchar *local_4110;
  undefined1 local_4108 [4];
  undefined1 auStack_4104 [12];
  uint64_t local_40f8;
  uint64_t uStack_40f0;
  uchar local_40e8;
  size_t local_40c8 [4];
  secp256k1_ge local_40a8;
  ulong local_4040;
  secp256k1_gej local_4038 [53];
  uint64_t local_2038 [1025];
  
  r = (secp256k1_ge *)local_4138;
  _local_4138 = ZEXT816(1);
  auStack_4128 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)r);
  secp256k1_scalar_negate((secp256k1_scalar *)r,(secp256k1_scalar *)r);
  secp256k1_scalar_inverse((secp256k1_scalar *)r,(secp256k1_scalar *)r);
  local_4158 = ZEXT816(1);
  auStack_4148 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4158);
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,local_4038,(secp256k1_scalar *)local_4158);
  secp256k1_ge_set_gej(&local_40a8,local_4038);
  local_40f8 = auStack_4128._0_8_;
  uStack_40f0 = auStack_4128._8_8_;
  _local_4108 = _local_4138;
  iVar12 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4158,(secp256k1_scalar *)r,&local_40a8,
                      (secp256k1_scalar *)local_4108);
  if (iVar12 != 0) goto LAB_001543b6;
  local_4158 = ZEXT816(1);
  auStack_4148 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4158);
  local_40a8.x.n[2] = 0;
  local_40a8.x.n[3] = 0;
  local_40a8.x.n[0] = 0;
  local_40a8.x.n[1] = 0;
  secp256k1_scalar_verify((secp256k1_scalar *)&local_40a8);
  local_40f8 = 0;
  uStack_40f0 = 0;
  _local_4108 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4108);
  iVar12 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,&DAT_00177480,0x21);
  if (iVar12 == 0) goto LAB_001543bb;
  iVar12 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4108,(secp256k1_scalar *)local_4158,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)&local_40a8);
  if (iVar12 != 0) goto LAB_001543c0;
  r = &local_40a8;
  local_40a8.x.n[1] = 0;
  local_40a8.x.n[2] = 0;
  local_40a8.x.n[3] = 0;
  local_40a8.x.n[0] = 2;
  local_40a8.x.n[4]._0_1_ = 1;
  auStack_4128 = ZEXT816(0);
  _local_4138 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4138);
  local_40f8 = 0;
  uStack_40f0 = 0;
  _local_4108 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4108);
  local_4158 = ZEXT816(1);
  auStack_4148 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4158);
  iVar12 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,(uchar *)r,0x21);
  if (iVar12 == 0) goto LAB_001543c5;
  iVar12 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4158,(secp256k1_scalar *)local_4138,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_4108);
  if (iVar12 != 0) goto LAB_001543ca;
  r = (secp256k1_ge *)local_4108;
  local_40f8 = 0;
  uStack_40f0 = 0;
  stack0xffffffffffffbef9 = ZEXT715(0);
  local_4108[0] = 2;
  local_40e8 = '\x02';
  local_4178._0_8_ = (_func_void_char_ptr_void_ptr *)0x2;
  local_4178._8_8_ = (void *)0x0;
  local_4178._16_8_ = 0;
  local_4178._24_8_ = 0;
  secp256k1_scalar_verify((secp256k1_scalar *)local_4178);
  auStack_4148 = ZEXT816(0);
  local_4158 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4158);
  _local_4138 = ZEXT816(2);
  auStack_4128 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4138);
  iVar12 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,(uchar *)r,0x21);
  if (iVar12 == 0) goto LAB_001543cf;
  iVar12 = secp256k1_eckey_pubkey_parse(&local_40a8,&DAT_001774b0,0x21);
  if (iVar12 == 0) goto LAB_001543d4;
  iVar12 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4138,(secp256k1_scalar *)local_4178,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_4158);
  if (iVar12 == 0) goto LAB_001543d9;
  iVar12 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4138,(secp256k1_scalar *)local_4178,&local_40a8,
                      (secp256k1_scalar *)local_4158);
  if (iVar12 == 0) goto LAB_001543de;
  r = (secp256k1_ge *)local_4178;
  secp256k1_scalar_negate((secp256k1_scalar *)r,(secp256k1_scalar *)r);
  iVar12 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4138,(secp256k1_scalar *)r,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_4158);
  if (iVar12 == 0) goto LAB_001543e3;
  iVar12 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4138,(secp256k1_scalar *)local_4178,&local_40a8,
                      (secp256k1_scalar *)local_4158);
  if (iVar12 == 0) goto LAB_001543e8;
  local_4178._0_8_ = (_func_void_char_ptr_void_ptr *)0x1;
  local_4178._8_8_ = (void *)0x0;
  local_4178._16_8_ = 0;
  local_4178._24_8_ = 0;
  r = (secp256k1_ge *)local_4178;
  secp256k1_scalar_verify((secp256k1_scalar *)r);
  iVar12 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4138,(secp256k1_scalar *)r,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_4158);
  if (iVar12 != 0) goto LAB_001543ed;
  iVar12 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4138,(secp256k1_scalar *)local_4178,&local_40a8,
                      (secp256k1_scalar *)local_4158);
  if (iVar12 != 0) goto LAB_001543f2;
  r = (secp256k1_ge *)0x1;
  _local_4138 = ZEXT816(1);
  auStack_4128 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4138);
  _local_4108 = ZEXT816(1);
  local_40f8 = 0;
  uStack_40f0 = 0;
  secp256k1_scalar_verify((secp256k1_scalar *)local_4108);
  secp256k1_scalar_set_b32((secp256k1_scalar *)local_4158,"",(int *)0x0);
  iVar12 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,&DAT_001774e0,0x21);
  if (iVar12 == 0) goto LAB_001543f7;
  iVar12 = secp256k1_eckey_pubkey_parse(&local_40a8,&DAT_00177510,0x21);
  if (iVar12 == 0) goto LAB_001543fc;
  iVar12 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4158,(secp256k1_scalar *)local_4138,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_4108);
  if (iVar12 == 0) goto LAB_00154401;
  iVar12 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4158,(secp256k1_scalar *)local_4138,&local_40a8,
                      (secp256k1_scalar *)local_4108);
  if (iVar12 == 0) goto LAB_00154406;
  r = (secp256k1_ge *)local_4138;
  secp256k1_scalar_negate((secp256k1_scalar *)r,(secp256k1_scalar *)r);
  iVar12 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4158,(secp256k1_scalar *)r,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_4108);
  if (iVar12 == 0) goto LAB_0015440b;
  iVar12 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4158,(secp256k1_scalar *)local_4138,&local_40a8,
                      (secp256k1_scalar *)local_4108);
  if (iVar12 == 0) goto LAB_00154410;
  _local_4138 = ZEXT816(2);
  auStack_4128 = ZEXT816(0);
  r = (secp256k1_ge *)local_4138;
  secp256k1_scalar_verify((secp256k1_scalar *)r);
  secp256k1_scalar_inverse_var((secp256k1_scalar *)r,(secp256k1_scalar *)r);
  iVar12 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4158,(secp256k1_scalar *)r,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_4108);
  if (iVar12 != 0) goto LAB_00154415;
  iVar12 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4158,(secp256k1_scalar *)local_4138,&local_40a8,
                      (secp256k1_scalar *)local_4108);
  if (iVar12 != 0) goto LAB_0015441a;
  local_4158 = ZEXT816(1);
  auStack_4148 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4158);
  r = &local_40a8;
  local_40a8.x.n[0] = 1;
  local_40a8.x.n[1] = 0;
  local_40a8.x.n[2] = 0;
  local_40a8.x.n[3] = 0;
  secp256k1_scalar_verify((secp256k1_scalar *)r);
  secp256k1_scalar_negate((secp256k1_scalar *)r,(secp256k1_scalar *)r);
  secp256k1_scalar_set_b32((secp256k1_scalar *)local_4108,"",(int *)0x0);
  iVar12 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,&DAT_00177540,0x21);
  if (iVar12 == 0) goto LAB_0015441f;
  iVar12 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4108,(secp256k1_scalar *)local_4158,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)&local_40a8);
  if (iVar12 == 0) goto LAB_00154424;
  r = (secp256k1_ge *)local_4158;
  secp256k1_scalar_negate((secp256k1_scalar *)r,(secp256k1_scalar *)r);
  iVar12 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4108,(secp256k1_scalar *)r,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)&local_40a8);
  if (iVar12 == 0) goto LAB_00154429;
  local_4158 = ZEXT816(3);
  auStack_4148 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4158);
  secp256k1_scalar_inverse_var((secp256k1_scalar *)local_4158,(secp256k1_scalar *)local_4158);
  r = (secp256k1_ge *)local_4108;
  iVar12 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)r,(secp256k1_scalar *)local_4158,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)&local_40a8);
  if (iVar12 != 0) goto LAB_0015442e;
  auStack_4148 = ZEXT816((ulong)0x100000000000000) << 0x40;
  local_4158 = ZEXT816(0);
  auStack_4128._8_8_ = 0xa9293eb931dddf65;
  auStack_4128._0_8_ = 0x62777a810be012b8;
  uStack_4130 = 0xf7f478316a9d5faa;
  local_4138 = (undefined1  [8])0x5344230681994186;
  iVar12 = secp256k1_ecdsa_sign
                     (CTX,(secp256k1_ecdsa_signature *)&local_40a8,local_4138,local_4158,
                      precomputed_nonce_function,"");
  if (iVar12 != 0) goto LAB_00154433;
  iVar12 = secp256k1_ecdsa_sign
                     (CTX,(secp256k1_ecdsa_signature *)&local_40a8,local_4138,local_4158,
                      precomputed_nonce_function,test_ecdsa_edge_cases::nonce2);
  if (iVar12 != 0) goto LAB_00154438;
  auStack_4128[0xf] = 0xaa;
  iVar12 = secp256k1_ecdsa_sign
                     (CTX,(secp256k1_ecdsa_signature *)&local_40a8,local_4138,local_4158,
                      precomputed_nonce_function,"");
  psVar20 = CTX;
  if (iVar12 != 1) goto LAB_0015443d;
  auVar6._12_4_ = 0;
  auVar6._0_12_ = auStack_4104;
  _local_4108 = auVar6 << 0x20;
  local_4038[0].x.n[0] = (uint64_t)(CTX->illegal_callback).fn;
  local_4038[0].x.n[1] = (uint64_t)(CTX->illegal_callback).data;
  if (secp256k1_context_static == CTX) goto LAB_00154442;
  (CTX->illegal_callback).fn = counting_callback_fn;
  (psVar20->illegal_callback).data = r;
LAB_00152fd4:
  iVar12 = secp256k1_ecdsa_sign
                     (CTX,(secp256k1_ecdsa_signature *)0x0,local_4138,local_4158,
                      precomputed_nonce_function,test_ecdsa_edge_cases::nonce2);
  psVar20 = CTX;
  if (iVar12 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
    (psVar20->illegal_callback).data = (void *)local_4038[0].x.n[1];
    if (local_4108 != (undefined1  [4])0x1) goto LAB_00154460;
    auVar7._12_4_ = 0;
    auVar7._0_12_ = auStack_4104;
    _local_4108 = auVar7 << 0x20;
    local_4038[0].x.n[0] = (uint64_t)(psVar20->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar20->illegal_callback).data;
    if (secp256k1_context_static == psVar20) goto LAB_00154465;
    (psVar20->illegal_callback).fn = counting_callback_fn;
    (psVar20->illegal_callback).data = r;
  }
  else {
    test_ecdsa_edge_cases_cold_12();
LAB_00154460:
    test_ecdsa_edge_cases_cold_13();
    psVar20 = extraout_RAX_00;
LAB_00154465:
    (*(psVar20->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar20->illegal_callback).data);
  }
  iVar12 = secp256k1_ecdsa_sign
                     (CTX,(secp256k1_ecdsa_signature *)&local_40a8,(uchar *)0x0,local_4158,
                      precomputed_nonce_function,test_ecdsa_edge_cases::nonce2);
  psVar20 = CTX;
  if (iVar12 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
    (psVar20->illegal_callback).data = (void *)local_4038[0].x.n[1];
    if (local_4108 != (undefined1  [4])0x1) goto LAB_00154483;
    auVar8._12_4_ = 0;
    auVar8._0_12_ = auStack_4104;
    _local_4108 = auVar8 << 0x20;
    local_4038[0].x.n[0] = (uint64_t)(psVar20->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar20->illegal_callback).data;
    if (secp256k1_context_static == psVar20) goto LAB_00154488;
    (psVar20->illegal_callback).fn = counting_callback_fn;
    (psVar20->illegal_callback).data = r;
  }
  else {
    test_ecdsa_edge_cases_cold_14();
LAB_00154483:
    test_ecdsa_edge_cases_cold_15();
    psVar20 = extraout_RAX_01;
LAB_00154488:
    (*(psVar20->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar20->illegal_callback).data);
  }
  msg32 = precomputed_nonce_function;
  iVar12 = secp256k1_ecdsa_sign
                     (CTX,(secp256k1_ecdsa_signature *)&local_40a8,local_4138,(uchar *)0x0,
                      precomputed_nonce_function,test_ecdsa_edge_cases::nonce2);
  psVar20 = CTX;
  if (iVar12 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
    (psVar20->illegal_callback).data = (void *)local_4038[0].x.n[1];
    if (local_4108 != (undefined1  [4])0x1) goto LAB_001544a6;
    msg32 = precomputed_nonce_function;
    iVar12 = secp256k1_ecdsa_sign
                       (psVar20,(secp256k1_ecdsa_signature *)&local_40a8,local_4138,local_4158,
                        precomputed_nonce_function,test_ecdsa_edge_cases::nonce2);
    if (iVar12 != 1) goto LAB_001544ab;
    iVar12 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)local_4108,local_4158);
    psVar20 = CTX;
    if (iVar12 == 0) goto LAB_001544b0;
    local_4178._0_8_ = local_4178._0_8_ & 0xffffffff00000000;
    local_4038[0].x.n[0] = (uint64_t)(CTX->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(CTX->illegal_callback).data;
    if (secp256k1_context_static == CTX) goto LAB_001544b5;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar20->illegal_callback).data = local_4178;
  }
  else {
    test_ecdsa_edge_cases_cold_16();
LAB_001544a6:
    test_ecdsa_edge_cases_cold_17();
LAB_001544ab:
    test_ecdsa_edge_cases_cold_18();
LAB_001544b0:
    test_ecdsa_edge_cases_cold_84();
    psVar20 = extraout_RAX_02;
LAB_001544b5:
    (*(psVar20->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar20->illegal_callback).data);
  }
  iVar12 = secp256k1_ecdsa_verify
                     (CTX,(secp256k1_ecdsa_signature *)0x0,local_4138,(secp256k1_pubkey *)local_4108
                     );
  psVar20 = CTX;
  if (iVar12 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
    (psVar20->illegal_callback).data = (void *)local_4038[0].x.n[1];
    if (local_4178._0_4_ != 1) goto LAB_001544d3;
    local_4178._0_8_ = local_4178._0_8_ & 0xffffffff00000000;
    local_4038[0].x.n[0] = (uint64_t)(psVar20->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar20->illegal_callback).data;
    if (secp256k1_context_static == psVar20) goto LAB_001544d8;
    (psVar20->illegal_callback).fn = counting_callback_fn;
    (psVar20->illegal_callback).data = local_4178;
  }
  else {
    test_ecdsa_edge_cases_cold_19();
LAB_001544d3:
    test_ecdsa_edge_cases_cold_20();
    psVar20 = extraout_RAX_03;
LAB_001544d8:
    (*(psVar20->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar20->illegal_callback).data);
  }
  iVar12 = secp256k1_ecdsa_verify
                     (CTX,(secp256k1_ecdsa_signature *)&local_40a8,(uchar *)0x0,
                      (secp256k1_pubkey *)local_4108);
  psVar20 = CTX;
  if (iVar12 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
    (psVar20->illegal_callback).data = (void *)local_4038[0].x.n[1];
    if (local_4178._0_4_ != 1) goto LAB_001544f6;
    local_4178._0_8_ = local_4178._0_8_ & 0xffffffff00000000;
    local_4038[0].x.n[0] = (uint64_t)(psVar20->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar20->illegal_callback).data;
    if (secp256k1_context_static == psVar20) goto LAB_001544fb;
    (psVar20->illegal_callback).fn = counting_callback_fn;
    (psVar20->illegal_callback).data = local_4178;
  }
  else {
    test_ecdsa_edge_cases_cold_21();
LAB_001544f6:
    test_ecdsa_edge_cases_cold_22();
    psVar20 = extraout_RAX_04;
LAB_001544fb:
    (*(psVar20->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar20->illegal_callback).data);
  }
  iVar12 = secp256k1_ecdsa_verify
                     (CTX,(secp256k1_ecdsa_signature *)&local_40a8,local_4138,
                      (secp256k1_pubkey *)0x0);
  psVar20 = CTX;
  if (iVar12 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
    (psVar20->illegal_callback).data = (void *)local_4038[0].x.n[1];
    if (local_4178._0_4_ != 1) goto LAB_00154519;
    iVar12 = secp256k1_ecdsa_verify
                       (psVar20,(secp256k1_ecdsa_signature *)&local_40a8,local_4138,
                        (secp256k1_pubkey *)local_4108);
    psVar20 = CTX;
    if (iVar12 == 0) goto LAB_0015451e;
    local_4178._0_8_ = local_4178._0_8_ & 0xffffffff00000000;
    local_4038[0].x.n[0] = (uint64_t)(CTX->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(CTX->illegal_callback).data;
    if (secp256k1_context_static == CTX) goto LAB_00154523;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar20->illegal_callback).data = local_4178;
  }
  else {
    test_ecdsa_edge_cases_cold_23();
LAB_00154519:
    test_ecdsa_edge_cases_cold_24();
LAB_0015451e:
    test_ecdsa_edge_cases_cold_83();
    psVar20 = extraout_RAX_05;
LAB_00154523:
    (*(psVar20->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar20->illegal_callback).data);
  }
  iVar12 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)local_4108,(uchar *)0x0);
  psVar20 = CTX;
  if (iVar12 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
    (psVar20->illegal_callback).data = (void *)local_4038[0].x.n[1];
    if (local_4178._0_4_ != 1) goto LAB_00154541;
    local_4178._0_8_ = local_4178._0_8_ & 0xffffffff00000000;
    local_4038[0].x.n[0] = (uint64_t)(psVar20->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar20->illegal_callback).data;
    if (secp256k1_context_static == psVar20) goto LAB_00154546;
    (psVar20->illegal_callback).fn = counting_callback_fn;
    (psVar20->illegal_callback).data = local_4178;
  }
  else {
    test_ecdsa_edge_cases_cold_25();
LAB_00154541:
    test_ecdsa_edge_cases_cold_26();
    psVar20 = extraout_RAX_06;
LAB_00154546:
    (*(psVar20->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar20->illegal_callback).data);
  }
  iVar12 = secp256k1_ecdsa_verify
                     (CTX,(secp256k1_ecdsa_signature *)&local_40a8,local_4138,
                      (secp256k1_pubkey *)local_4108);
  psVar20 = CTX;
  if (iVar12 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
    (psVar20->illegal_callback).data = (void *)local_4038[0].x.n[1];
    if (local_4178._0_4_ != 1) goto LAB_00154564;
    local_40c8[0] = 0x48;
    local_4178._0_8_ = local_4178._0_8_ & 0xffffffff00000000;
    local_4038[0].x.n[0] = (uint64_t)(psVar20->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar20->illegal_callback).data;
    if (secp256k1_context_static == psVar20) goto LAB_00154569;
    (psVar20->illegal_callback).fn = counting_callback_fn;
    (psVar20->illegal_callback).data = local_4178;
  }
  else {
    test_ecdsa_edge_cases_cold_27();
LAB_00154564:
    test_ecdsa_edge_cases_cold_28();
    psVar20 = extraout_RAX_07;
LAB_00154569:
    (*(psVar20->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar20->illegal_callback).data);
  }
  iVar12 = secp256k1_ecdsa_signature_serialize_der
                     (CTX,(uchar *)0x0,local_40c8,(secp256k1_ecdsa_signature *)&local_40a8);
  psVar20 = CTX;
  if (iVar12 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
    (psVar20->illegal_callback).data = (void *)local_4038[0].x.n[1];
    if (local_4178._0_4_ != 1) goto LAB_00154587;
    local_4180 = local_4180 & 0xffffffff00000000;
    local_4178._0_8_ = (psVar20->illegal_callback).fn;
    local_4178._8_8_ = (psVar20->illegal_callback).data;
    if (secp256k1_context_static == psVar20) goto LAB_0015458c;
    (psVar20->illegal_callback).fn = counting_callback_fn;
    (psVar20->illegal_callback).data = &local_4180;
  }
  else {
    test_ecdsa_edge_cases_cold_29();
LAB_00154587:
    test_ecdsa_edge_cases_cold_30();
    psVar20 = extraout_RAX_08;
LAB_0015458c:
    (*(psVar20->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar20->illegal_callback).data);
  }
  iVar12 = secp256k1_ecdsa_signature_serialize_der
                     (CTX,(uchar *)local_4038,(size_t *)0x0,(secp256k1_ecdsa_signature *)&local_40a8
                     );
  psVar20 = CTX;
  if (iVar12 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178._0_8_;
    (psVar20->illegal_callback).data = (void *)local_4178._8_8_;
    if ((int)local_4180 != 1) goto LAB_001545aa;
    local_4180 = local_4180 & 0xffffffff00000000;
    local_4178._0_8_ = (psVar20->illegal_callback).fn;
    local_4178._8_8_ = (psVar20->illegal_callback).data;
    if (secp256k1_context_static == psVar20) goto LAB_001545af;
    (psVar20->illegal_callback).fn = counting_callback_fn;
    (psVar20->illegal_callback).data = &local_4180;
  }
  else {
    test_ecdsa_edge_cases_cold_31();
LAB_001545aa:
    test_ecdsa_edge_cases_cold_32();
    psVar20 = extraout_RAX_09;
LAB_001545af:
    (*(psVar20->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar20->illegal_callback).data);
  }
  iVar12 = secp256k1_ecdsa_signature_serialize_der
                     (CTX,(uchar *)local_4038,local_40c8,(secp256k1_ecdsa_signature *)0x0);
  psVar20 = CTX;
  if (iVar12 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178._0_8_;
    (psVar20->illegal_callback).data = (void *)local_4178._8_8_;
    if ((int)local_4180 != 1) goto LAB_001545cd;
    iVar12 = secp256k1_ecdsa_signature_serialize_der
                       (psVar20,(uchar *)local_4038,local_40c8,
                        (secp256k1_ecdsa_signature *)&local_40a8);
    psVar20 = CTX;
    if (iVar12 == 0) goto LAB_001545d2;
    local_4180 = local_4180 & 0xffffffff00000000;
    local_4178._0_8_ = (CTX->illegal_callback).fn;
    local_4178._8_8_ = (CTX->illegal_callback).data;
    if (secp256k1_context_static == CTX) goto LAB_001545d7;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar20->illegal_callback).data = &local_4180;
  }
  else {
    test_ecdsa_edge_cases_cold_33();
LAB_001545cd:
    test_ecdsa_edge_cases_cold_34();
LAB_001545d2:
    test_ecdsa_edge_cases_cold_82();
    psVar20 = extraout_RAX_10;
LAB_001545d7:
    (*(psVar20->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar20->illegal_callback).data);
  }
  iVar12 = secp256k1_ecdsa_signature_parse_der
                     (CTX,(secp256k1_ecdsa_signature *)0x0,(uchar *)local_4038,local_40c8[0]);
  psVar20 = CTX;
  if (iVar12 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178._0_8_;
    (psVar20->illegal_callback).data = (void *)local_4178._8_8_;
    if ((int)local_4180 != 1) goto LAB_001545f5;
    local_4180 = local_4180 & 0xffffffff00000000;
    local_4178._0_8_ = (psVar20->illegal_callback).fn;
    local_4178._8_8_ = (psVar20->illegal_callback).data;
    if (secp256k1_context_static == psVar20) goto LAB_001545fa;
    (psVar20->illegal_callback).fn = counting_callback_fn;
    (psVar20->illegal_callback).data = &local_4180;
  }
  else {
    test_ecdsa_edge_cases_cold_35();
LAB_001545f5:
    test_ecdsa_edge_cases_cold_36();
    psVar20 = extraout_RAX_11;
LAB_001545fa:
    (*(psVar20->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar20->illegal_callback).data);
  }
  iVar12 = secp256k1_ecdsa_signature_parse_der
                     (CTX,(secp256k1_ecdsa_signature *)&local_40a8,(uchar *)0x0,local_40c8[0]);
  psVar20 = CTX;
  if (iVar12 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178._0_8_;
    (psVar20->illegal_callback).data = (void *)local_4178._8_8_;
    if ((int)local_4180 != 1) goto LAB_00154618;
    iVar12 = secp256k1_ecdsa_signature_parse_der
                       (psVar20,(secp256k1_ecdsa_signature *)&local_40a8,(uchar *)local_4038,
                        local_40c8[0]);
    if (iVar12 == 0) goto LAB_0015461d;
    local_40c8[0] = 10;
    iVar12 = secp256k1_ecdsa_signature_serialize_der
                       (CTX,(uchar *)local_4038,local_40c8,(secp256k1_ecdsa_signature *)&local_40a8)
    ;
    psVar20 = CTX;
    if (iVar12 != 0) goto LAB_00154622;
    local_4180 = local_4180 & 0xffffffff00000000;
    local_4178._0_8_ = (CTX->illegal_callback).fn;
    local_4178._8_8_ = (CTX->illegal_callback).data;
    if (secp256k1_context_static == CTX) goto LAB_00154627;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar20->illegal_callback).data = &local_4180;
  }
  else {
    test_ecdsa_edge_cases_cold_37();
LAB_00154618:
    test_ecdsa_edge_cases_cold_38();
LAB_0015461d:
    test_ecdsa_edge_cases_cold_81();
LAB_00154622:
    test_ecdsa_edge_cases_cold_39();
    psVar20 = extraout_RAX_12;
LAB_00154627:
    (*(psVar20->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar20->illegal_callback).data);
  }
  iVar12 = secp256k1_ecdsa_signature_normalize
                     (CTX,(secp256k1_ecdsa_signature *)0x0,(secp256k1_ecdsa_signature *)0x0);
  psVar20 = CTX;
  if (iVar12 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178._0_8_;
    (psVar20->illegal_callback).data = (void *)local_4178._8_8_;
    if ((int)local_4180 != 1) goto LAB_00154645;
    local_4180 = local_4180 & 0xffffffff00000000;
    local_4178._0_8_ = (psVar20->illegal_callback).fn;
    local_4178._8_8_ = (psVar20->illegal_callback).data;
    if (secp256k1_context_static == psVar20) goto LAB_0015464a;
    (psVar20->illegal_callback).fn = counting_callback_fn;
    (psVar20->illegal_callback).data = &local_4180;
  }
  else {
    test_ecdsa_edge_cases_cold_40();
LAB_00154645:
    test_ecdsa_edge_cases_cold_41();
    psVar20 = extraout_RAX_13;
LAB_0015464a:
    (*(psVar20->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar20->illegal_callback).data);
  }
  iVar12 = secp256k1_ecdsa_signature_serialize_compact
                     (CTX,(uchar *)0x0,(secp256k1_ecdsa_signature *)&local_40a8);
  psVar20 = CTX;
  if (iVar12 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178._0_8_;
    (psVar20->illegal_callback).data = (void *)local_4178._8_8_;
    if ((int)local_4180 != 1) goto LAB_00154668;
    local_4180 = local_4180 & 0xffffffff00000000;
    local_4178._0_8_ = (psVar20->illegal_callback).fn;
    local_4178._8_8_ = (psVar20->illegal_callback).data;
    if (secp256k1_context_static == psVar20) goto LAB_0015466d;
    (psVar20->illegal_callback).fn = counting_callback_fn;
    (psVar20->illegal_callback).data = &local_4180;
  }
  else {
    test_ecdsa_edge_cases_cold_42();
LAB_00154668:
    test_ecdsa_edge_cases_cold_43();
    psVar20 = extraout_RAX_14;
LAB_0015466d:
    (*(psVar20->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar20->illegal_callback).data);
  }
  iVar12 = secp256k1_ecdsa_signature_serialize_compact
                     (CTX,(uchar *)local_4038,(secp256k1_ecdsa_signature *)0x0);
  psVar20 = CTX;
  if (iVar12 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178._0_8_;
    (psVar20->illegal_callback).data = (void *)local_4178._8_8_;
    if ((int)local_4180 != 1) goto LAB_0015468b;
    iVar12 = secp256k1_ecdsa_signature_serialize_compact
                       (psVar20,(uchar *)local_4038,(secp256k1_ecdsa_signature *)&local_40a8);
    psVar20 = CTX;
    if (iVar12 == 0) goto LAB_00154690;
    local_4180 = local_4180 & 0xffffffff00000000;
    local_4178._0_8_ = (CTX->illegal_callback).fn;
    local_4178._8_8_ = (CTX->illegal_callback).data;
    if (secp256k1_context_static == CTX) goto LAB_00154695;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar20->illegal_callback).data = &local_4180;
  }
  else {
    test_ecdsa_edge_cases_cold_44();
LAB_0015468b:
    test_ecdsa_edge_cases_cold_45();
LAB_00154690:
    test_ecdsa_edge_cases_cold_80();
    psVar20 = extraout_RAX_15;
LAB_00154695:
    (*(psVar20->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar20->illegal_callback).data);
  }
  iVar12 = secp256k1_ecdsa_signature_parse_compact
                     (CTX,(secp256k1_ecdsa_signature *)0x0,(uchar *)local_4038);
  psVar20 = CTX;
  if (iVar12 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178._0_8_;
    (psVar20->illegal_callback).data = (void *)local_4178._8_8_;
    if ((int)local_4180 != 1) goto LAB_001546b3;
    local_4180 = local_4180 & 0xffffffff00000000;
    local_4178._0_8_ = (psVar20->illegal_callback).fn;
    local_4178._8_8_ = (psVar20->illegal_callback).data;
    if (secp256k1_context_static == psVar20) goto LAB_001546b8;
    (psVar20->illegal_callback).fn = counting_callback_fn;
    (psVar20->illegal_callback).data = &local_4180;
  }
  else {
    test_ecdsa_edge_cases_cold_46();
LAB_001546b3:
    test_ecdsa_edge_cases_cold_47();
    psVar20 = extraout_RAX_16;
LAB_001546b8:
    (*(psVar20->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar20->illegal_callback).data);
  }
  psVar18 = CTX;
  iVar12 = secp256k1_ecdsa_signature_parse_compact
                     (CTX,(secp256k1_ecdsa_signature *)&local_40a8,(uchar *)0x0);
  psVar20 = CTX;
  if (iVar12 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178._0_8_;
    (psVar20->illegal_callback).data = (void *)local_4178._8_8_;
    if ((int)local_4180 != 1) goto LAB_001546d6;
    iVar12 = secp256k1_ecdsa_signature_parse_compact
                       (psVar20,(secp256k1_ecdsa_signature *)&local_40a8,(uchar *)local_4038);
    if (iVar12 == 0) goto LAB_001546db;
    local_4038[0].y.n[0]._0_4_ = 0xffffffff;
    local_4038[0].y.n[0]._4_4_ = 0xffffffff;
    local_4038[0].y.n[1]._0_4_ = 0xffffffff;
    local_4038[0].y.n[1]._4_4_ = 0xffffffff;
    local_4038[0].x.n[4] = 0xffffffffffffffff;
    local_4038[0].x.magnitude = -1;
    local_4038[0].x.normalized = -1;
    local_4038[0].x.n[2] = 0xffffffffffffffff;
    local_4038[0].x.n[3] = 0xffffffffffffffff;
    local_4038[0].x.n[0] = 0xffffffffffffffff;
    local_4038[0].x.n[1] = 0xffffffffffffffff;
    psVar20 = CTX;
    iVar12 = secp256k1_ecdsa_signature_parse_compact
                       (CTX,(secp256k1_ecdsa_signature *)&local_40a8,(uchar *)local_4038);
    if (iVar12 == 0) {
      r = (secp256k1_ge *)local_4138;
      uVar15 = 0;
      do {
        local_4110 = "";
        if ((int)uVar15 == 0) {
          local_4110 = (uchar *)0x0;
        }
        _local_4138 = (undefined1  [16])0x0;
        auStack_4128._0_15_ = SUB1615((undefined1  [16])0x0,0);
        auStack_4128[0xf] = 1;
        local_4158._8_4_ = 0xffffffff;
        local_4158._0_8_ = 0xffffffffffffffff;
        local_4158._12_4_ = 0xffffffff;
        auStack_4148._8_4_ = 0xffffffff;
        auStack_4148._0_8_ = 0xffffffffffffffff;
        auStack_4148._12_4_ = 0xffffffff;
        local_4040 = uVar15;
        iVar12 = secp256k1_ecdsa_sign
                           (CTX,(secp256k1_ecdsa_signature *)&local_40a8,(uchar *)r,local_4158,
                            (secp256k1_nonce_function)0x0,local_4110);
        if (iVar12 != 0) goto LAB_00154370;
        lVar13 = 0;
        do {
          cVar11 = *(char *)((long)local_40a8.x.n + lVar13);
          if (cVar11 != '\0') goto LAB_00153adb;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0x40);
        cVar11 = '\0';
LAB_00153adb:
        if (cVar11 != '\0') goto LAB_00154375;
        auStack_4148 = (undefined1  [16])0x0;
        local_4158 = (undefined1  [16])0x0;
        iVar12 = secp256k1_ecdsa_sign
                           (CTX,(secp256k1_ecdsa_signature *)&local_40a8,(uchar *)r,local_4158,
                            (secp256k1_nonce_function)0x0,local_4110);
        if (iVar12 != 0) goto LAB_0015437a;
        lVar13 = 0;
        do {
          cVar11 = *(char *)((long)local_40a8.x.n + lVar13);
          if (cVar11 != '\0') goto LAB_00153b30;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0x40);
        cVar11 = '\0';
LAB_00153b30:
        if (cVar11 != '\0') goto LAB_0015437f;
        auStack_4148[0xf] = 1;
        iVar12 = secp256k1_ecdsa_sign
                           (CTX,(secp256k1_ecdsa_signature *)&local_40a8,(uchar *)r,local_4158,
                            nonce_function_test_fail,local_4110);
        if (iVar12 != 0) goto LAB_00154384;
        lVar13 = 0;
        do {
          cVar11 = *(char *)((long)local_40a8.x.n + lVar13);
          if (cVar11 != '\0') goto LAB_00153b82;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0x40);
        cVar11 = '\0';
LAB_00153b82:
        if (cVar11 != '\0') goto LAB_00154389;
        iVar12 = secp256k1_ecdsa_sign
                           (CTX,(secp256k1_ecdsa_signature *)&local_40a8,(uchar *)r,local_4158,
                            nonce_function_test_retry,local_4110);
        if (iVar12 != 1) goto LAB_0015438e;
        lVar13 = 0;
        do {
          cVar11 = *(char *)((long)local_40a8.x.n + lVar13);
          if (cVar11 != '\0') goto LAB_00153bd0;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0x40);
        cVar11 = '\0';
LAB_00153bd0:
        if (cVar11 == '\0') goto LAB_00154393;
        iVar12 = secp256k1_ecdsa_sign
                           (CTX,(secp256k1_ecdsa_signature *)local_4108,(uchar *)r,local_4158,
                            nonce_function_rfc6979,local_4110);
        if (iVar12 != 1) goto LAB_00154398;
        lVar13 = 0;
        do {
          cVar11 = local_4108[lVar13];
          if (cVar11 != '\0') goto LAB_00153c23;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0x40);
        cVar11 = '\0';
LAB_00153c23:
        if (cVar11 == '\0') goto LAB_0015439d;
        lVar13 = 0;
        do {
          bVar1 = *(byte *)((long)local_40a8.x.n + lVar13);
          iVar12 = (uint)bVar1 - (uint)(byte)local_4108[lVar13];
          if (bVar1 != local_4108[lVar13]) goto LAB_00153c56;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0x40);
        iVar12 = 0;
LAB_00153c56:
        if (iVar12 != 0) goto LAB_001543a2;
        iVar12 = secp256k1_ecdsa_sign
                           (CTX,(secp256k1_ecdsa_signature *)local_4108,(uchar *)r,local_4158,
                            (secp256k1_nonce_function)0x0,local_4110);
        if (iVar12 != 1) goto LAB_001543a7;
        lVar13 = 0;
        do {
          cVar11 = local_4108[lVar13];
          if (cVar11 != '\0') goto LAB_00153ca5;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0x40);
        cVar11 = '\0';
LAB_00153ca5:
        if (cVar11 == '\0') goto LAB_001543ac;
        lVar13 = 0;
        do {
          bVar1 = *(byte *)((long)local_40a8.x.n + lVar13);
          iVar12 = (uint)bVar1 - (uint)(byte)local_4108[lVar13];
          if (bVar1 != local_4108[lVar13]) goto LAB_00153cd8;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0x40);
        iVar12 = 0;
LAB_00153cd8:
        if (iVar12 != 0) goto LAB_001543b1;
        lVar13 = 0;
        do {
          local_4138[0] = (char)lVar13;
          iVar12 = secp256k1_ecdsa_sign
                             (CTX,(secp256k1_ecdsa_signature *)local_4108,(uchar *)r,local_4158,
                              (secp256k1_nonce_function)0x0,local_4110);
          psVar16 = r;
          if (iVar12 != 1) goto LAB_0015435c;
          lVar14 = 0;
          do {
            cVar11 = local_4108[lVar14];
            if (cVar11 != '\0') goto LAB_00153d2f;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 0x40);
          cVar11 = '\0';
LAB_00153d2f:
          if (cVar11 == '\0') goto LAB_00154361;
          local_4038[0].x.n[lVar13 * 4 + 2] = local_40f8;
          local_4038[0].x.n[lVar13 * 4 + 3] = uStack_40f0;
          local_4038[0].x.n[lVar13 * 4] = _local_4108;
          local_4038[0].x.n[lVar13 * 4 + 1] = auStack_4104._4_8_;
          if (lVar13 != 0) {
            puVar17 = local_4038[0].x.n + lVar13 * 4;
            r_00 = local_4038;
            lVar14 = lVar13;
            do {
              secp256k1_scalar_verify((secp256k1_scalar *)puVar17);
              secp256k1_scalar_verify((secp256k1_scalar *)r_00);
              if ((((*puVar17 == (r_00->x).n[0]) &&
                   (local_4038[0].x.n[lVar13 * 4 + 1] == (r_00->x).n[1])) &&
                  (local_4038[0].x.n[lVar13 * 4 + 2] == (r_00->x).n[2])) &&
                 (local_4038[0].x.n[lVar13 * 4 + 3] == (r_00->x).n[3])) goto LAB_00154357;
              r_00 = (secp256k1_gej *)((r_00->x).n + 4);
              lVar14 = lVar14 + -1;
            } while (lVar14 != 0);
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0x100);
        auVar9[0xf] = 0;
        auVar9._0_15_ = stack0xffffffffffffbec9;
        _local_4138 = auVar9 << 8;
        auStack_4128[0xf] = 2;
        lVar13 = 0x100;
        psVar21 = (secp256k1_ge *)0x2000;
        do {
          local_4158[0] = (char)lVar13;
          iVar12 = secp256k1_ecdsa_sign
                             (CTX,(secp256k1_ecdsa_signature *)local_4108,(uchar *)r,local_4158,
                              (secp256k1_nonce_function)0x0,local_4110);
          if (iVar12 != 1) goto LAB_00154366;
          lVar14 = 0;
          do {
            cVar11 = local_4108[lVar14];
            if (cVar11 != '\0') goto LAB_00153e32;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 0x40);
          cVar11 = '\0';
LAB_00153e32:
          if (cVar11 == '\0') goto LAB_0015436b;
          puVar17 = local_4038[0].x.n + lVar13 * 4;
          local_4038[0].x.n[lVar13 * 4 + 2] = local_40f8;
          local_4038[0].x.n[lVar13 * 4 + 3] = uStack_40f0;
          *puVar17 = _local_4108;
          local_4038[0].x.n[lVar13 * 4 + 1] = auStack_4104._4_8_;
          psVar16 = (secp256k1_ge *)0x0;
          do {
            r_01 = (secp256k1_scalar *)((long)local_4038[0].x.n + (long)(psVar16->x).n);
            secp256k1_scalar_verify((secp256k1_scalar *)puVar17);
            secp256k1_scalar_verify(r_01);
            if (((*puVar17 == r_01->d[0]) &&
                (local_4038[0].x.n[lVar13 * 4 + 1] ==
                 *(uint64_t *)((long)(local_4038[0].x.n + 1) + (long)psVar16))) &&
               ((local_4038[0].x.n[lVar13 * 4 + 2] ==
                 *(uint64_t *)((long)(local_4038[0].x.n + 2) + (long)psVar16) &&
                (local_4038[0].x.n[lVar13 * 4 + 3] ==
                 *(uint64_t *)((long)(local_4038[0].x.n + 3) + (long)psVar16))))) {
              test_ecdsa_edge_cases_cold_65();
LAB_00154357:
              test_ecdsa_edge_cases_cold_63();
              goto LAB_0015435c;
            }
            psVar16 = (secp256k1_ge *)((psVar16->x).n + 4);
          } while (psVar21 != psVar16);
          lVar13 = lVar13 + 1;
          psVar21 = (secp256k1_ge *)((psVar21->x).n + 4);
        } while (lVar13 != 0x200);
        uVar15 = (ulong)((int)local_4040 + 1);
      } while ((int)local_4040 == 0);
      msg32 = (code *)local_4108;
      local_40f8 = 0;
      uStack_40f0 = 0;
      _local_4108 = (undefined1  [16])0x0;
      lVar13 = 0;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uStack_4130;
      _local_4138 = auVar10 << 0x40;
      local_4178._0_8_ = (_func_void_char_ptr_void_ptr *)0x0;
      local_40c8[0] = 0;
      local_4038[0].x.n[0] = 0x4d430001;
      local_4038[0].x.n[1] = (uint64_t)local_40c8;
      local_4038[0].x.n[2] = 0x20;
      local_4038[0].x.n[3] = 0;
      local_4038[0].x.n[4] = 0;
      local_4038[0].x.magnitude = 0;
      local_4038[0].x.normalized = 0;
      local_4180 = 0;
      nonce_function_rfc6979(local_4158,(uchar *)msg32,(uchar *)msg32,(uchar *)0x0,(void *)0x0,0);
      local_4038[0].x.n[0] = 0x4d430005;
      local_4038[0].x.n[2] = 0x20;
      local_4038[0].x.n[3] = 0;
      local_4038[0].x.n[4] = 0;
      local_4038[0].x.magnitude = 0;
      local_4038[0].x.normalized = 0;
      local_4180 = 0;
      local_4038[0].x.n[1] = (uint64_t)local_4158;
      nonce_function_rfc6979((uchar *)r,(uchar *)msg32,(uchar *)msg32,(uchar *)msg32,(void *)0x0,0);
      local_4038[0].x.n[0] = 0x4d430005;
      local_4038[0].x.n[2] = 0x20;
      local_4038[0].x.n[3] = 0;
      local_4038[0].x.n[4] = 0;
      local_4038[0].x.magnitude = 0;
      local_4038[0].x.normalized = 0;
      local_4180 = 0;
      local_4038[0].x.n[1] = (uint64_t)r;
      nonce_function_rfc6979(local_4178,(uchar *)msg32,(uchar *)msg32,(uchar *)0x0,msg32,0);
      local_4038[0].x.n[0] = 0x4d430005;
      local_4038[0].x.n[2] = 0x20;
      local_4038[0].x.n[3] = 0;
      local_4038[0].x.n[4] = 0;
      local_4038[0].x.magnitude = 0;
      local_4038[0].x.normalized = 0;
      local_4180 = 0;
      psVar19 = local_40c8;
      local_4038[0].x.n[1] = (uint64_t)local_4178;
      nonce_function_rfc6979
                ((uchar *)local_40c8,(uchar *)msg32,(uchar *)msg32,(uchar *)msg32,msg32,0);
      local_4038[0].x.n[0] = 0x4d430005;
      local_4038[0].x.n[1] = (uint64_t)local_40c8;
      local_4038[0].x.n[2] = 0x20;
      local_4038[0].x.n[3] = 0;
      local_4038[0].x.n[4] = 0;
      local_4038[0].x.magnitude = 0;
      local_4038[0].x.normalized = 0;
      uVar15 = (ulong)((long)psVar19 << 3) >> 0x33;
      uVar2 = (((long)psVar19 << 3 | (ulong)psVar19 >> 0x3d) << 0xd | uVar15) >> 3;
      psVar20 = (secp256k1_context *)(uVar2 << 0x33 | (uVar15 << 0x3d | uVar2) >> 0xd);
      local_4180 = 0;
      do {
        iVar12 = (uint)(byte)local_4158[lVar13] - (uint)(byte)local_4138[lVar13];
        if (local_4158[lVar13] != local_4138[lVar13]) goto LAB_001541d0;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x20);
      iVar12 = 0;
LAB_001541d0:
      if (iVar12 == 0) {
LAB_001546e5:
        test_ecdsa_edge_cases_cold_73();
LAB_001546ea:
        test_ecdsa_edge_cases_cold_72();
LAB_001546ef:
        test_ecdsa_edge_cases_cold_71();
LAB_001546f4:
        test_ecdsa_edge_cases_cold_70();
LAB_001546f9:
        test_ecdsa_edge_cases_cold_69();
LAB_001546fe:
        test_ecdsa_edge_cases_cold_68();
      }
      else {
        lVar13 = 0;
        do {
          bVar1 = local_4178[lVar13];
          psVar20 = (secp256k1_context *)(ulong)bVar1;
          iVar12 = (uint)(byte)local_4158[lVar13] - (uint)bVar1;
          if (local_4158[lVar13] != bVar1) goto LAB_001541fd;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0x20);
        iVar12 = 0;
LAB_001541fd:
        if (iVar12 == 0) goto LAB_001546ea;
        lVar13 = 0;
        do {
          bVar1 = *(byte *)((long)local_40c8 + lVar13);
          psVar20 = (secp256k1_context *)(ulong)bVar1;
          iVar12 = (uint)(byte)local_4158[lVar13] - (uint)bVar1;
          if (local_4158[lVar13] != bVar1) goto LAB_0015422d;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0x20);
        iVar12 = 0;
LAB_0015422d:
        if (iVar12 == 0) goto LAB_001546ef;
        lVar13 = 0;
        do {
          bVar1 = local_4178[lVar13];
          psVar20 = (secp256k1_context *)(ulong)bVar1;
          iVar12 = (uint)(byte)local_4138[lVar13] - (uint)bVar1;
          if (local_4138[lVar13] != bVar1) goto LAB_0015425a;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0x20);
        iVar12 = 0;
LAB_0015425a:
        if (iVar12 == 0) goto LAB_001546f4;
        lVar13 = 0;
        do {
          bVar1 = *(byte *)((long)local_40c8 + lVar13);
          psVar20 = (secp256k1_context *)(ulong)bVar1;
          iVar12 = (uint)(byte)local_4138[lVar13] - (uint)bVar1;
          if (local_4138[lVar13] != bVar1) goto LAB_0015428a;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0x20);
        iVar12 = 0;
LAB_0015428a:
        if (iVar12 == 0) goto LAB_001546f9;
        lVar13 = 0;
        do {
          bVar1 = *(byte *)((long)local_40c8 + lVar13);
          psVar20 = (secp256k1_context *)(ulong)bVar1;
          iVar12 = (uint)(byte)local_4178[lVar13] - (uint)bVar1;
          if (local_4178[lVar13] != bVar1) goto LAB_001542ba;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0x20);
        iVar12 = 0;
LAB_001542ba:
        if (iVar12 == 0) goto LAB_001546fe;
        local_40f8._0_1_ = 0xba;
        local_40f8._1_1_ = 0xae;
        local_40f8._2_1_ = 0xdc;
        local_40f8._3_1_ = 0xe6;
        local_40f8._4_1_ = 0xaf;
        local_40f8._5_1_ = 'H';
        local_40f8._6_1_ = 0xa0;
        local_40f8._7_1_ = ';';
        uStack_40f0._0_1_ = 0xbf;
        uStack_40f0._1_1_ = 0xd2;
        uStack_40f0._2_1_ = '^';
        uStack_40f0._3_1_ = 0x8c;
        uStack_40f0._4_1_ = 0xd0;
        uStack_40f0._5_1_ = '6';
        uStack_40f0._6_1_ = 'A';
        uStack_40f0._7_1_ = 'A';
        auStack_4104[4] = 0xff;
        auStack_4104[5] = 0xff;
        auStack_4104[6] = 0xff;
        auStack_4104[7] = 0xff;
        auStack_4104[8] = 0xff;
        auStack_4104[9] = 0xff;
        auStack_4104[10] = 0xff;
        auStack_4104[0xb] = 0xfe;
        local_4108[0] = 0xff;
        local_4108[1] = 0xff;
        local_4108[2] = 0xff;
        local_4108[3] = 0xff;
        auStack_4104[0] = 0xff;
        auStack_4104[1] = 0xff;
        auStack_4104[2] = 0xff;
        auStack_4104[3] = 0xff;
        local_4158._0_8_ = 300;
        msg32 = (code *)0x0;
        psVar20 = CTX;
        iVar12 = ec_privkey_export_der(CTX,(uchar *)local_4038,(size_t *)local_4158,local_4108,0);
        if (iVar12 == 0) {
          local_4158._0_8_ = 300;
          msg32 = (code *)0x1;
          psVar20 = CTX;
          iVar12 = ec_privkey_export_der(CTX,(uchar *)local_4038,(size_t *)local_4158,local_4108,1);
          if (iVar12 == 0) {
            return;
          }
          goto LAB_00154708;
        }
      }
      test_ecdsa_edge_cases_cold_66();
LAB_00154708:
      test_ecdsa_edge_cases_cold_67();
      uVar3 = *(undefined8 *)msg32;
      uVar4 = *(uint64_t *)(msg32 + 8);
      uVar5 = *(uint64_t *)(msg32 + 0x18);
      (psVar20->ecmult_gen_ctx).scalar_offset.d[1] = *(uint64_t *)(msg32 + 0x10);
      (psVar20->ecmult_gen_ctx).scalar_offset.d[2] = uVar5;
      *(undefined8 *)&psVar20->ecmult_gen_ctx = uVar3;
      (psVar20->ecmult_gen_ctx).scalar_offset.d[0] = uVar4;
      return;
    }
  }
  else {
    test_ecdsa_edge_cases_cold_48();
    psVar20 = psVar18;
LAB_001546d6:
    test_ecdsa_edge_cases_cold_49();
LAB_001546db:
    test_ecdsa_edge_cases_cold_79();
  }
  test_ecdsa_edge_cases_cold_50();
  goto LAB_001546e5;
LAB_0015435c:
  test_ecdsa_edge_cases_cold_62();
  r = psVar16;
LAB_00154361:
  test_ecdsa_edge_cases_cold_75();
LAB_00154366:
  test_ecdsa_edge_cases_cold_64();
LAB_0015436b:
  test_ecdsa_edge_cases_cold_74();
LAB_00154370:
  test_ecdsa_edge_cases_cold_51();
LAB_00154375:
  test_ecdsa_edge_cases_cold_52();
LAB_0015437a:
  test_ecdsa_edge_cases_cold_53();
LAB_0015437f:
  test_ecdsa_edge_cases_cold_54();
LAB_00154384:
  test_ecdsa_edge_cases_cold_55();
LAB_00154389:
  test_ecdsa_edge_cases_cold_56();
LAB_0015438e:
  test_ecdsa_edge_cases_cold_57();
LAB_00154393:
  test_ecdsa_edge_cases_cold_78();
LAB_00154398:
  test_ecdsa_edge_cases_cold_58();
LAB_0015439d:
  test_ecdsa_edge_cases_cold_77();
LAB_001543a2:
  test_ecdsa_edge_cases_cold_59();
LAB_001543a7:
  test_ecdsa_edge_cases_cold_60();
LAB_001543ac:
  test_ecdsa_edge_cases_cold_76();
LAB_001543b1:
  test_ecdsa_edge_cases_cold_61();
LAB_001543b6:
  test_ecdsa_edge_cases_cold_1();
LAB_001543bb:
  test_ecdsa_edge_cases_cold_101();
LAB_001543c0:
  test_ecdsa_edge_cases_cold_2();
LAB_001543c5:
  test_ecdsa_edge_cases_cold_100();
LAB_001543ca:
  test_ecdsa_edge_cases_cold_3();
LAB_001543cf:
  test_ecdsa_edge_cases_cold_99();
LAB_001543d4:
  test_ecdsa_edge_cases_cold_98();
LAB_001543d9:
  test_ecdsa_edge_cases_cold_97();
LAB_001543de:
  test_ecdsa_edge_cases_cold_96();
LAB_001543e3:
  test_ecdsa_edge_cases_cold_95();
LAB_001543e8:
  test_ecdsa_edge_cases_cold_94();
LAB_001543ed:
  test_ecdsa_edge_cases_cold_4();
LAB_001543f2:
  test_ecdsa_edge_cases_cold_5();
LAB_001543f7:
  test_ecdsa_edge_cases_cold_93();
LAB_001543fc:
  test_ecdsa_edge_cases_cold_92();
LAB_00154401:
  test_ecdsa_edge_cases_cold_91();
LAB_00154406:
  test_ecdsa_edge_cases_cold_90();
LAB_0015440b:
  test_ecdsa_edge_cases_cold_89();
LAB_00154410:
  test_ecdsa_edge_cases_cold_88();
LAB_00154415:
  test_ecdsa_edge_cases_cold_6();
LAB_0015441a:
  test_ecdsa_edge_cases_cold_7();
LAB_0015441f:
  test_ecdsa_edge_cases_cold_87();
LAB_00154424:
  test_ecdsa_edge_cases_cold_86();
LAB_00154429:
  test_ecdsa_edge_cases_cold_85();
LAB_0015442e:
  test_ecdsa_edge_cases_cold_8();
LAB_00154433:
  test_ecdsa_edge_cases_cold_9();
LAB_00154438:
  test_ecdsa_edge_cases_cold_10();
LAB_0015443d:
  test_ecdsa_edge_cases_cold_11();
  psVar20 = extraout_RAX;
LAB_00154442:
  (*(psVar20->illegal_callback).fn)
            ("ctx != secp256k1_context_static",(psVar20->illegal_callback).data);
  goto LAB_00152fd4;
}

Assistant:

static void test_ecdsa_edge_cases(void) {
    int t;
    secp256k1_ecdsa_signature sig;

    /* Test the case where ECDSA recomputes a point that is infinity. */
    {
        secp256k1_gej keyj;
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_negate(&ss, &ss);
        secp256k1_scalar_inverse(&ss, &ss);
        secp256k1_scalar_set_int(&sr, 1);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &keyj, &sr);
        secp256k1_ge_set_gej(&key, &keyj);
        msg = ss;
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with r of zero fails. */
    {
        const unsigned char pubkey_mods_zero[33] = {
            0x02, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xfe, 0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0,
            0x3b, 0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41,
            0x41
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 0);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey_mods_zero, 33));
        CHECK(secp256k1_ecdsa_sig_verify( &sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with s of zero fails. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x01
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 0);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 1);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with message 0 passes. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x02
        };
        const unsigned char pubkey2[33] = {
            0x02, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xfe, 0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0,
            0x3b, 0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41,
            0x43
        };
        secp256k1_ge key;
        secp256k1_ge key2;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 2);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 2);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0);
    }

    /* Verify signature with message 1 passes. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x14, 0x4e, 0x5a, 0x58, 0xef, 0x5b, 0x22,
            0x6f, 0xd2, 0xe2, 0x07, 0x6a, 0x77, 0xcf, 0x05,
            0xb4, 0x1d, 0xe7, 0x4a, 0x30, 0x98, 0x27, 0x8c,
            0x93, 0xe6, 0xe6, 0x3c, 0x0b, 0xc4, 0x73, 0x76,
            0x25
        };
        const unsigned char pubkey2[33] = {
            0x02, 0x8a, 0xd5, 0x37, 0xed, 0x73, 0xd9, 0x40,
            0x1d, 0xa0, 0x33, 0xd2, 0xdc, 0xf0, 0xaf, 0xae,
            0x34, 0xcf, 0x5f, 0x96, 0x4c, 0x73, 0x28, 0x0f,
            0x92, 0xc0, 0xf6, 0x9d, 0xd9, 0xb2, 0x09, 0x10,
            0x62
        };
        const unsigned char csr[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
            0x45, 0x51, 0x23, 0x19, 0x50, 0xb7, 0x5f, 0xc4,
            0x40, 0x2d, 0xa1, 0x72, 0x2f, 0xc9, 0xba, 0xeb
        };
        secp256k1_ge key;
        secp256k1_ge key2;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 1);
        secp256k1_scalar_set_b32(&sr, csr, NULL);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 2);
        secp256k1_scalar_inverse_var(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0);
    }

    /* Verify signature with message -1 passes. */
    {
        const unsigned char pubkey[33] = {
            0x03, 0xaf, 0x97, 0xff, 0x7d, 0x3a, 0xf6, 0xa0,
            0x02, 0x94, 0xbd, 0x9f, 0x4b, 0x2e, 0xd7, 0x52,
            0x28, 0xdb, 0x49, 0x2a, 0x65, 0xcb, 0x1e, 0x27,
            0x57, 0x9c, 0xba, 0x74, 0x20, 0xd5, 0x1d, 0x20,
            0xf1
        };
        const unsigned char csr[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
            0x45, 0x51, 0x23, 0x19, 0x50, 0xb7, 0x5f, 0xc4,
            0x40, 0x2d, 0xa1, 0x72, 0x2f, 0xc9, 0xba, 0xee
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 1);
        secp256k1_scalar_negate(&msg, &msg);
        secp256k1_scalar_set_b32(&sr, csr, NULL);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 3);
        secp256k1_scalar_inverse_var(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Signature where s would be zero. */
    {
        secp256k1_pubkey pubkey;
        size_t siglen;
        unsigned char signature[72];
        static const unsigned char nonce[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
        };
        static const unsigned char nonce2[32] = {
            0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
            0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFE,
            0xBA,0xAE,0xDC,0xE6,0xAF,0x48,0xA0,0x3B,
            0xBF,0xD2,0x5E,0x8C,0xD0,0x36,0x41,0x40
        };
        const unsigned char key[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
        };
        unsigned char msg[32] = {
            0x86, 0x41, 0x99, 0x81, 0x06, 0x23, 0x44, 0x53,
            0xaa, 0x5f, 0x9d, 0x6a, 0x31, 0x78, 0xf4, 0xf7,
            0xb8, 0x12, 0xe0, 0x0b, 0x81, 0x7a, 0x77, 0x62,
            0x65, 0xdf, 0xdd, 0x31, 0xb9, 0x3e, 0x29, 0xa9,
        };
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 0);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 0);
        msg[31] = 0xaa;
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_sign(CTX, NULL, msg, key, precomputed_nonce_function, nonce2));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_sign(CTX, &sig, NULL, key, precomputed_nonce_function, nonce2));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_sign(CTX, &sig, msg, NULL, precomputed_nonce_function, nonce2));
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 1);
        CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, key) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, NULL, msg, &pubkey));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, &sig, NULL, &pubkey));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, &sig, msg, NULL));
        CHECK(secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_create(CTX, &pubkey, NULL));
        /* That pubkeyload fails via an ARGCHECK is a little odd but makes sense because pubkeys are an opaque data type. */
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey));
        siglen = 72;
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_der(CTX, NULL, &siglen, &sig));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_der(CTX, signature, NULL, &sig));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, NULL));
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_der(CTX, NULL, signature, siglen));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_der(CTX, &sig, NULL, siglen));
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, signature, siglen) == 1);
        siglen = 10;
        /* Too little room for a signature does not fail via ARGCHECK. */
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 0);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_normalize(CTX, NULL, NULL));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_compact(CTX, NULL, &sig));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_compact(CTX, signature, NULL));
        CHECK(secp256k1_ecdsa_signature_serialize_compact(CTX, signature, &sig) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_compact(CTX, NULL, signature));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_compact(CTX, &sig, NULL));
        CHECK(secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 1);
        memset(signature, 255, 64);
        CHECK(secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 0);
    }

    /* Nonce function corner cases. */
    for (t = 0; t < 2; t++) {
        static const unsigned char zero[32] = {0x00};
        int i;
        unsigned char key[32];
        unsigned char msg[32];
        secp256k1_ecdsa_signature sig2;
        secp256k1_scalar sr[512], ss;
        const unsigned char *extra;
        extra = t == 0 ? NULL : zero;
        memset(msg, 0, 32);
        msg[31] = 1;
        /* High key results in signature failure. */
        memset(key, 0xFF, 32);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* Zero key results in signature failure. */
        memset(key, 0, 32);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* Nonce function failure results in signature failure. */
        key[31] = 1;
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_fail, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* The retry loop successfully makes its way to the first good value. */
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_retry, extra) == 1);
        CHECK(!is_empty_signature(&sig));
        CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, nonce_function_rfc6979, extra) == 1);
        CHECK(!is_empty_signature(&sig2));
        CHECK(secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0);
        /* The default nonce function is deterministic. */
        CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
        CHECK(!is_empty_signature(&sig2));
        CHECK(secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0);
        /* The default nonce function changes output with different messages. */
        for(i = 0; i < 256; i++) {
            int j;
            msg[0] = i;
            CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
            CHECK(!is_empty_signature(&sig2));
            secp256k1_ecdsa_signature_load(CTX, &sr[i], &ss, &sig2);
            for (j = 0; j < i; j++) {
                CHECK(!secp256k1_scalar_eq(&sr[i], &sr[j]));
            }
        }
        msg[0] = 0;
        msg[31] = 2;
        /* The default nonce function changes output with different keys. */
        for(i = 256; i < 512; i++) {
            int j;
            key[0] = i - 256;
            CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
            CHECK(!is_empty_signature(&sig2));
            secp256k1_ecdsa_signature_load(CTX, &sr[i], &ss, &sig2);
            for (j = 0; j < i; j++) {
                CHECK(!secp256k1_scalar_eq(&sr[i], &sr[j]));
            }
        }
        key[0] = 0;
    }

    {
        /* Check that optional nonce arguments do not have equivalent effect. */
        const unsigned char zeros[32] = {0};
        unsigned char nonce[32];
        unsigned char nonce2[32];
        unsigned char nonce3[32];
        unsigned char nonce4[32];
        SECP256K1_CHECKMEM_UNDEFINE(nonce,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce2,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce3,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce4,32);
        CHECK(nonce_function_rfc6979(nonce, zeros, zeros, NULL, NULL, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce,32);
        CHECK(nonce_function_rfc6979(nonce2, zeros, zeros, zeros, NULL, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce2,32);
        CHECK(nonce_function_rfc6979(nonce3, zeros, zeros, NULL, (void *)zeros, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce3,32);
        CHECK(nonce_function_rfc6979(nonce4, zeros, zeros, zeros, (void *)zeros, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce4,32);
        CHECK(secp256k1_memcmp_var(nonce, nonce2, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce, nonce3, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce, nonce4, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce2, nonce3, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce2, nonce4, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce3, nonce4, 32) != 0);
    }


    /* Privkey export where pubkey is the point at infinity. */
    {
        unsigned char privkey[300];
        unsigned char seckey[32] = {
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xfe,
            0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0, 0x3b,
            0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41, 0x41,
        };
        size_t outlen = 300;
        CHECK(!ec_privkey_export_der(CTX, privkey, &outlen, seckey, 0));
        outlen = 300;
        CHECK(!ec_privkey_export_der(CTX, privkey, &outlen, seckey, 1));
    }
}